

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void art_replace(art_inner_node_t *node,art_typecode_t typecode,art_key_chunk_t key_chunk,
                art_ref_t new_child)

{
  art_ref_t in_RCX;
  art_key_chunk_t in_DL;
  undefined1 in_SIL;
  art_node256_t *in_RDI;
  
  switch(in_SIL) {
  case 2:
    art_node4_replace((art_node4_t *)in_RDI,in_DL,in_RCX);
    break;
  case 3:
    art_node16_replace((art_node16_t *)in_RDI,in_DL,in_RCX);
    break;
  case 4:
    art_node48_replace((art_node48_t *)in_RDI,in_DL,in_RCX);
    break;
  case 5:
    art_node256_replace(in_RDI,in_DL,in_RCX);
  }
  return;
}

Assistant:

static void art_replace(art_inner_node_t *node, art_typecode_t typecode,
                        art_key_chunk_t key_chunk, art_ref_t new_child) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            art_node4_replace((art_node4_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE16_TYPE:
            art_node16_replace((art_node16_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE48_TYPE:
            art_node48_replace((art_node48_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE256_TYPE:
            art_node256_replace((art_node256_t *)node, key_chunk, new_child);
            break;
        default:
            assert(false);
    }
}